

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::AllocateInlineCache(FunctionBody *this)

{
  code *pcVar1;
  ThreadContext *pTVar2;
  ThreadContext *pTVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  PropertyId PVar7;
  void ***pppvVar8;
  undefined4 *puVar9;
  Recycler *pRVar10;
  uchar *puVar11;
  InlineCacheAllocator *pIVar12;
  InlineCache *pIVar13;
  ScriptContext *this_00;
  PropertyRecord *pPVar14;
  CacheAllocator *pCVar15;
  void *pvVar16;
  TrackAllocData local_150;
  code *local_128;
  undefined8 local_120;
  TrackAllocData local_118;
  uint local_ec;
  uint local_e8;
  uint rootObjectStoreInlineCacheEnd;
  uint rootObjectLoadMethodInlineCacheEnd;
  uint rootObjectLoadInlineCacheEnd;
  ThreadContext *threadContext;
  RootObjectBase *rootObject;
  undefined8 local_c8;
  TrackAllocData local_c0;
  uint local_98;
  uint local_94;
  uint plainInlineCacheEnd;
  uint i;
  undefined8 local_88;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  void **local_20;
  void **inlineCaches;
  uint totalCacheCount;
  uint isInstInlineCacheStart;
  FunctionBody *this_local;
  
  _totalCacheCount = this;
  pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->inlineCaches);
  if (*pppvVar8 != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1883,"(this->inlineCaches == nullptr)",
                                "this->inlineCaches == nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar5 = GetInlineCacheCount(this);
  inlineCaches._4_4_ = uVar5;
  uVar6 = GetIsInstInlineCacheCount(this);
  inlineCaches._0_4_ = uVar5 + uVar6;
  if ((uint)inlineCaches != 0) {
    pRVar10 = ScriptContext::GetRecycler
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&void*::typeinfo,0,(ulong)(uint)inlineCaches,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x188b);
    pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_48);
    local_58 = Memory::Recycler::AllocZero;
    local_50 = 0;
    local_20 = Memory::AllocateArray<Memory::Recycler,void*,false>
                         ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocZero,0,
                          (ulong)(uint)inlineCaches);
    pRVar10 = ScriptContext::GetRecycler
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&unsigned_char::typeinfo,0,(ulong)(uint)inlineCaches,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x188e);
    pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_80);
    _plainInlineCacheEnd = Memory::Recycler::AllocLeafZero;
    local_88 = 0;
    puVar11 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                        ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                         (ulong)(uint)inlineCaches);
    Memory::WriteBarrierPtr<unsigned_char>::operator=(&this->m_inlineCacheTypes,puVar11);
    local_94 = 0;
    local_98 = GetRootObjectLoadInlineCacheStart(this);
    for (; local_94 < local_98; local_94 = local_94 + 1) {
      pIVar12 = ScriptContext::GetInlineCacheAllocator
                          ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c0,(type_info *)&InlineCache::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                 ,0x1896);
      pIVar12 = (InlineCacheAllocator *)
                Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
                TrackAllocInfo(&pIVar12->
                                super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                               ,&local_c0);
      rootObject = (RootObjectBase *)Memory::InlineCacheAllocator::AllocZero;
      local_c8 = 0;
      pIVar13 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,pIVar12,0xa3a9c0);
      InlineCache::InlineCache(pIVar13);
      local_20[local_94] = pIVar13;
    }
    threadContext = (ThreadContext *)GetRootObject(this);
    this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
    _rootObjectLoadMethodInlineCacheEnd = ScriptContext::GetThreadContext(this_00);
    rootObjectStoreInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart(this);
    for (; pTVar3 = threadContext, pTVar2 = _rootObjectLoadMethodInlineCacheEnd,
        local_94 < rootObjectStoreInlineCacheEnd; local_94 = local_94 + 1) {
      PVar7 = GetPropertyIdFromCacheId(this,local_94);
      pPVar14 = ThreadContext::GetPropertyName(pTVar2,PVar7);
      pIVar13 = RootObjectBase::GetInlineCache((RootObjectBase *)pTVar3,pPVar14,false,false);
      local_20[local_94] = pIVar13;
    }
    local_e8 = GetRootObjectStoreInlineCacheStart(this);
    for (; pTVar3 = threadContext, pTVar2 = _rootObjectLoadMethodInlineCacheEnd, local_94 < local_e8
        ; local_94 = local_94 + 1) {
      PVar7 = GetPropertyIdFromCacheId(this,local_94);
      pPVar14 = ThreadContext::GetPropertyName(pTVar2,PVar7);
      pIVar13 = RootObjectBase::GetInlineCache((RootObjectBase *)pTVar3,pPVar14,true,false);
      local_20[local_94] = pIVar13;
    }
    local_ec = inlineCaches._4_4_;
    for (; pTVar3 = threadContext, pTVar2 = _rootObjectLoadMethodInlineCacheEnd, local_94 < local_ec
        ; local_94 = local_94 + 1) {
      PVar7 = GetPropertyIdFromCacheId(this,local_94);
      pPVar14 = ThreadContext::GetPropertyName(pTVar2,PVar7);
      pIVar13 = RootObjectBase::GetInlineCache((RootObjectBase *)pTVar3,pPVar14,false,true);
      local_20[local_94] = pIVar13;
    }
    for (; local_94 < (uint)inlineCaches; local_94 = local_94 + 1) {
      pCVar15 = ScriptContext::GetIsInstInlineCacheAllocator
                          ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_118,(type_info *)&IsInstInlineCache::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                 ,0x18b3);
      pCVar15 = (CacheAllocator *)
                Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo(&pCVar15->
                                super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>
                               ,&local_118);
      local_128 = Memory::CacheAllocator::AllocZero;
      local_120 = 0;
      pvVar16 = new<Memory::CacheAllocator>(0x20,pCVar15,0xa3a700);
      local_20[local_94] = pvVar16;
    }
    pRVar10 = ScriptContext::GetRecycler
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_150,(type_info *)&unsigned_char::typeinfo,0,(ulong)(uint)inlineCaches,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x18b7);
    pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_150);
    puVar11 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                        ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                         (ulong)(uint)inlineCaches);
    Memory::WriteBarrierPtr<unsigned_char>::operator=(&this->m_inlineCacheTypes,puVar11);
    Memory::WriteBarrierPtr<void_*>::operator=(&this->inlineCaches,local_20);
  }
  return;
}

Assistant:

void FunctionBody::AllocateInlineCache()
    {
        Assert(this->inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + GetIsInstInlineCacheCount();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            void ** inlineCaches = RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(),
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    this->m_scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = this->GetRootObject();
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    this->m_scriptContext->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->inlineCaches = inlineCaches;
        }
    }